

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::SortHelper<Memory::WriteBarrierPtr<void>>
              (Var array,CompareVarsInfo *cvInfo)

{
  WriteBarrierPtr<void> *addr;
  Type TVar1;
  code *pcVar2;
  WriteBarrierPtr<void> WVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  TempArenaAllocatorObject *tempAllocator;
  RecyclableObject *this;
  JavascriptArray *pJVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint32 uVar12;
  uint length;
  ScriptContext *pSVar13;
  size_t requestedBytes;
  ulong uVar14;
  WriteBarrierPtr<void> local_88;
  Var item;
  WriteBarrierPtr<void> *local_78;
  Var local_70;
  ScriptContext *local_68;
  undefined1 local_60 [8];
  JsReentLock jsReentLock;
  RecyclableObject *local_38;
  RecyclableObject *obj;
  
  pSVar13 = cvInfo->scriptContext;
  local_60 = (undefined1  [8])pSVar13->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_60)->noJsReentrancy;
  ((ThreadContext *)local_60)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_60,array);
  local_38 = (RecyclableObject *)0x0;
  BVar5 = JavascriptConversion::ToObject(array,pSVar13,&local_38);
  if (BVar5 == 0) {
    JavascriptError::ThrowTypeError(pSVar13,-0x7ff5ec42,L"Array.prototype.sort");
  }
  *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  local_68 = pSVar13;
  local_70 = JavascriptOperators::OP_GetLength(local_38,pSVar13);
  uVar11 = (ulong)local_70 & 0x1ffff00000000;
  if (uVar11 == 0x1000000000000 || ((ulong)local_70 & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)local_70 & 0xffff000000000000) == 0x1000000000000) goto LAB_00b903f1;
    uVar12 = JavascriptConversion::ToUInt32_Full(local_70,local_68);
    local_70 = (Var)CONCAT44(extraout_var,uVar12);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00b909f0;
    *puVar6 = 0;
LAB_00b903f1:
    if (uVar11 != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_00b909f0;
      *puVar6 = 0;
    }
  }
  JsReentLock::MutateArrayObject((JsReentLock *)local_60);
  *(bool *)((long)local_60 + 0x108) = true;
  if ((uint32)local_70 == 0) goto LAB_00b909d0;
  tempAllocator = ScriptContext::GetTemporaryAllocator(local_68,L"Runtime");
  BVar5 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar5 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar4) goto LAB_00b909f0;
    *puVar6 = 0;
  }
  requestedBytes = ((ulong)local_70 & 0xffffffff) << 3;
  local_78 = (WriteBarrierPtr<void> *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             AllocInternal(&(tempAllocator->allocator).
                            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                           ,requestedBytes);
  if (local_78 == (WriteBarrierPtr<void> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    jsReentLock._24_8_ = __tls_get_addr(&PTR_01548f08);
    *(undefined4 *)jsReentLock._24_8_ = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar4) {
LAB_00b909f0:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *(undefined4 *)jsReentLock._24_8_ = 0;
  }
  else {
    jsReentLock._24_8_ = __tls_get_addr(&PTR_01548f08);
  }
  uVar12 = 0;
  memset(local_78,0,requestedBytes);
  iVar10 = 0;
  item = (Var)0x0;
  uVar11 = 0;
  pSVar13 = local_68;
  do {
    *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    BVar5 = JavascriptOperators::HasItem(local_38,uVar12);
    JsReentLock::MutateArrayObject((JsReentLock *)local_60);
    *(bool *)((long)local_60 + 0x108) = true;
    if (BVar5 == 0) {
LAB_00b906b9:
      iVar10 = iVar10 + 1;
    }
    else {
      local_88.ptr = (Var)0x0;
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      BVar5 = JavascriptOperators::GetItem(local_38,uVar12,&local_88.ptr,pSVar13);
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      WVar3.ptr = local_88.ptr;
      *(bool *)((long)local_60 + 0x108) = true;
      if (BVar5 == 0) goto LAB_00b906b9;
      if (local_88.ptr == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *(undefined4 *)jsReentLock._24_8_ = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_00b909f0;
        *(undefined4 *)jsReentLock._24_8_ = 0;
LAB_00b90723:
        this = UnsafeVarTo<Js::RecyclableObject>(WVar3.ptr);
        if (this == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *(undefined4 *)jsReentLock._24_8_ = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar4) goto LAB_00b909f0;
          *(undefined4 *)jsReentLock._24_8_ = 0;
        }
        TVar1 = ((this->type).ptr)->typeId;
        if (0x57 < (int)TVar1) {
          BVar5 = RecyclableObject::IsExternal(this);
          if (BVar5 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *(undefined4 *)jsReentLock._24_8_ = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            goto LAB_00b907da;
          }
          goto LAB_00b907ec;
        }
        if (TVar1 != TypeIds_Undefined) goto LAB_00b907ec;
        item = (Var)(ulong)((int)item + 1);
        pSVar13 = local_68;
      }
      else {
        if (((ulong)local_88.ptr & 0x1ffff00000000) == 0x1000000000000 ||
            ((ulong)local_88.ptr & 0xffff000000000000) != 0x1000000000000) {
          if ((ulong)local_88.ptr >> 0x32 == 0 &&
              ((ulong)local_88.ptr & 0xffff000000000000) != 0x1000000000000) goto LAB_00b90723;
        }
        else {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *(undefined4 *)jsReentLock._24_8_ = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
LAB_00b907da:
          if (bVar4 == false) goto LAB_00b909f0;
          *(undefined4 *)jsReentLock._24_8_ = 0;
        }
LAB_00b907ec:
        WVar3.ptr = local_88.ptr;
        addr = local_78 + uVar11;
        Memory::Recycler::WBSetBit((char *)addr);
        addr->ptr = WVar3.ptr;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
        uVar11 = (ulong)((int)uVar11 + 1);
        pSVar13 = local_68;
      }
    }
    uVar12 = uVar12 + 1;
  } while ((uint32)local_70 != uVar12);
  *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  length = (uint)uVar11;
  if (length < 0x200) {
    InsertionSort<Memory::WriteBarrierPtr<void>>(local_78,length,cvInfo);
    JsReentLock::MutateArrayObject((JsReentLock *)local_60);
    *(bool *)((long)local_60 + 0x108) = true;
    if (length != 0) goto LAB_00b90897;
  }
  else {
    MergeSort<Memory::WriteBarrierPtr<void>>(local_78,length,cvInfo,&tempAllocator->allocator);
    JsReentLock::MutateArrayObject((JsReentLock *)local_60);
    *(bool *)((long)local_60 + 0x108) = true;
LAB_00b90897:
    uVar14 = 0;
    do {
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      JavascriptOperators::SetItem
                (local_38,local_38,(uint32)uVar14,local_78[uVar14].ptr,pSVar13,
                 PropertyOperation_ThrowIfNonWritable|PropertyOperation_ThrowIfNotExtensible,0);
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      *(bool *)((long)local_60 + 0x108) = true;
      uVar14 = uVar14 + 1;
    } while (uVar11 != uVar14);
  }
  iVar8 = (int)item;
  if (iVar8 != 0) {
    do {
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      JavascriptOperators::SetItem
                (local_38,local_38,(uint32)uVar11,
                 (((pSVar13->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).undefinedValue.ptr,pSVar13,
                 PropertyOperation_ThrowIfNonWritable|PropertyOperation_ThrowIfNotExtensible,0);
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      *(bool *)((long)local_60 + 0x108) = true;
      uVar11 = (ulong)((uint32)uVar11 + 1);
      uVar9 = (int)item - 1;
      item = (Var)(ulong)uVar9;
    } while (uVar9 != 0);
    uVar11 = (ulong)(iVar8 + length);
  }
  if (iVar10 != 0) {
    do {
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      JavascriptOperators::DeleteItem
                (local_38,(uint32)uVar11,PropertyOperation_ThrowOnDeleteIfNotConfig);
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      *(bool *)((long)local_60 + 0x108) = true;
      uVar11 = (ulong)((uint32)uVar11 + 1);
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
  }
  ScriptContext::ReleaseTemporaryAllocator(local_68,tempAllocator);
  bVar4 = DynamicObject::IsAnyArray(local_38);
  if (bVar4) {
    pJVar7 = UnsafeVarTo<Js::JavascriptArray,Js::RecyclableObject>(local_38);
    ClearSegmentMap(pJVar7);
    pJVar7 = UnsafeVarTo<Js::JavascriptArray,Js::RecyclableObject>(local_38);
    (*(pJVar7->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
      .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])(pJVar7);
  }
LAB_00b909d0:
  *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return local_38;
}

Assistant:

Var JavascriptArray::SortHelper(Var array, JavascriptArray::CompareVarsInfo* cvInfo)
    {
        ScriptContext* scriptContext = cvInfo->scriptContext;
        
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, array);

        // Per spec, throw if the 'this' value is not a valid object
        RecyclableObject* obj = nullptr;
        if (FALSE == JavascriptConversion::ToObject(array, scriptContext, &obj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.sort"));
        }

        // Get the Length
        JS_REENTRANT(jsReentLock,
            uint32 len = JavascriptConversion::ToUInt32(JavascriptOperators::OP_GetLength(obj, scriptContext), scriptContext));

        // Early return if length = 0
        // Note cannot return early for length = 1 without further checks
        // As per spec we must use HasItem() and GetItem() on each element
        if (len == 0)
        {
            return obj;
        }

        BEGIN_TEMP_ALLOCATOR(tempAlloc, scriptContext, _u("Runtime"))
        {
            // Spec mandates that we copy the array into a 'list' before sorting
            // This severely limits the potential for sort side-effects to alter the result
            T* list = AnewArray(tempAlloc, T, len);

            uint32 values = 0;
            uint32 undefinedValues = 0;
            uint32 holes = 0;
            uint32 i = 0, j = 0;

            for (; i < len; ++i)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, i));
                
                if (hasItem)
                {
                    Var item = nullptr;
                    JS_REENTRANT(jsReentLock, BOOL gotItem = JavascriptOperators::GetItem(obj, i, &item, scriptContext));
                    if (gotItem)
                    {
                        TypeId type = JavascriptOperators::GetTypeId(item);
                        if (type != TypeIds_Undefined)
                        {
                            // If T = Var this adds item to the list
                            // If T = StringItem this creates a StringItem from the Var and adds that to the list
                            SortSetHelper(list, item, values, &jsReentLock, scriptContext);
                            values++;
                        }
                        else
                        {
                            ++undefinedValues;
                        }
                    }
                    else
                    {
                        ++holes;
                    }
                }
                else
                {
                    ++holes;
                }
            }

            // Call the appropriate Sorting Algorithm
            // Insertion sort uses less memory and is quicker on short arrays but gets less efficient as arrays get longer
            if (values < 512)
            {
                JS_REENTRANT(jsReentLock, JavascriptArray::InsertionSort<T>(list, values, cvInfo));
            }
            else
            {
                JS_REENTRANT(jsReentLock, JavascriptArray::MergeSort<T>(list, values, cvInfo, tempAlloc));
            }

            // Write the sorted data back to the original array
            // Undefined values and holes are placed at the end
            for (i = 0; i < values; ++i)
            {
                JS_REENTRANT(jsReentLock, JavascriptOperators::SetItem(obj, obj, i, SortGetHelper(list, i), scriptContext, static_cast<PropertyOperationFlags>(PropertyOperation_ThrowIfNonWritable | PropertyOperation_ThrowIfNotExtensible)));
            }
            for (; j < undefinedValues; ++j, ++i)
            {
                JS_REENTRANT(jsReentLock, JavascriptOperators::SetItem(obj, obj, i, scriptContext->GetLibrary()->GetUndefined(), scriptContext, static_cast<PropertyOperationFlags>(PropertyOperation_ThrowIfNonWritable | PropertyOperation_ThrowIfNotExtensible)));
            }
            for (j = 0; j < holes; ++j, ++i)
            {
                JS_REENTRANT(jsReentLock, JavascriptOperators::DeleteItem(obj, i, PropertyOperation_ThrowOnDeleteIfNotConfig));
            }
        }
        END_TEMP_ALLOCATOR(tempAlloc, scriptContext);

        // if the Array is not just an array-like object but an actual array we clear the Segment map
        // optimised access CC generates for arrays that may have been mangled by sorting
        if (VarIs<JavascriptArray>(obj))
        {
            UnsafeVarTo<JavascriptArray>(obj)->ClearSegmentMap();
            #ifdef VALIDATE_ARRAY
            UnsafeVarTo<JavascriptArray>(obj)->ValidateArray();
            #endif
        }

        return obj;
    }